

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HouseholderSequence.h
# Opt level: O0

EssentialVectorType * __thiscall
Eigen::
HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
::essentialVector(EssentialVectorType *__return_storage_ptr__,
                 HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                 *this,Index k)

{
  bool bVar1;
  Index k_local;
  HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
  *this_local;
  
  bVar1 = false;
  if (-1 < k) {
    bVar1 = k < this->m_length;
  }
  if (!bVar1) {
    __assert_fail("k >= 0 && k < m_length",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Householder/HouseholderSequence.h"
                  ,0xc6,
                  "const EssentialVectorType Eigen::HouseholderSequence<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::essentialVector(Index) const [VectorsType = Eigen::Matrix<double, -1, -1>, CoeffsType = Eigen::Matrix<double, -1, 1>, Side = 1]"
                 );
  }
  internal::
  hseq_side_dependent_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
  ::essentialVector(__return_storage_ptr__,this,k);
  return __return_storage_ptr__;
}

Assistant:

const EssentialVectorType essentialVector(Index k) const
    {
      eigen_assert(k >= 0 && k < m_length);
      return internal::hseq_side_dependent_impl<VectorsType,CoeffsType,Side>::essentialVector(*this, k);
    }